

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawSplineLinear(Vector2 *points,int pointCount,float thick,Color color)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector2 local_58;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (1 < pointCount) {
    fVar4 = 0.0;
    for (uVar1 = 0; pointCount - 1 != uVar1; uVar1 = uVar1 + 1) {
      fStack_50 = points[uVar1].x;
      fStack_4c = points[uVar1].y;
      fStack_40 = points[uVar1 + 1].x;
      fStack_3c = points[uVar1 + 1].y;
      fVar2 = fStack_40 - fStack_50;
      fVar3 = fStack_3c - fStack_4c;
      fVar5 = SQRT(fVar2 * fVar2 + fVar3 * fVar3);
      fVar4 = (float)(~-(uint)(0.0 < fVar5) & (uint)fVar4 |
                     (uint)(thick / (fVar5 + fVar5)) & -(uint)(0.0 < fVar5));
      local_48 = fVar3 * -fVar4;
      fVar3 = fVar3 * -fVar4;
      local_58.x = fStack_50 - local_48;
      local_58.y = fStack_4c - fVar2 * fVar4;
      fStack_50 = fStack_50 + fVar3;
      fStack_4c = fStack_4c + fVar2 * fVar4;
      local_48 = fStack_40 - local_48;
      fStack_44 = fStack_3c - fVar2 * fVar4;
      fStack_40 = fStack_40 + fVar3;
      fStack_3c = fStack_3c + fVar2 * fVar4;
      DrawTriangleStrip(&local_58,4,color);
    }
  }
  return;
}

Assistant:

void DrawSplineLinear(const Vector2 *points, int pointCount, float thick, Color color)
{
    if (pointCount < 2) return;

#if defined(SUPPORT_SPLINE_MITERS)
    Vector2 prevNormal = (Vector2){-(points[1].y - points[0].y), (points[1].x - points[0].x)};
    float prevLength = sqrtf(prevNormal.x*prevNormal.x + prevNormal.y*prevNormal.y);

    if (prevLength > 0.0f)
    {
        prevNormal.x /= prevLength;
        prevNormal.y /= prevLength;
    }
    else
    {
        prevNormal.x = 0.0f;
        prevNormal.y = 0.0f;
    }

    Vector2 prevRadius = { 0.5f*thick*prevNormal.x, 0.5f*thick*prevNormal.y };

    for (int i = 0; i < pointCount - 1; i++)
    {
        Vector2 normal = { 0 };

        if (i < pointCount - 2)
        {
            normal = (Vector2){-(points[i + 2].y - points[i + 1].y), (points[i + 2].x - points[i + 1].x)};
            float normalLength = sqrtf(normal.x*normal.x + normal.y*normal.y);

            if (normalLength > 0.0f)
            {
                normal.x /= normalLength;
                normal.y /= normalLength;
            }
            else
            {
                normal.x = 0.0f;
                normal.y = 0.0f;
            }
        }
        else
        {
            normal = prevNormal;
        }

        Vector2 radius = { prevNormal.x + normal.x, prevNormal.y + normal.y };
        float radiusLength = sqrtf(radius.x*radius.x + radius.y*radius.y);

        if (radiusLength > 0.0f)
        {
            radius.x /= radiusLength;
            radius.y /= radiusLength;
        }
        else
        {
            radius.x = 0.0f;
            radius.y = 0.0f;
        }

        float cosTheta = radius.x*normal.x + radius.y*normal.y;

        if (cosTheta != 0.0f)
        {
            radius.x *= (thick*0.5f/cosTheta);
            radius.y *= (thick*0.5f/cosTheta);
        }
        else
        {
            radius.x = 0.0f;
            radius.y = 0.0f;
        }

        Vector2 strip[4] = {
            { points[i].x - prevRadius.x, points[i].y - prevRadius.y },
            { points[i].x + prevRadius.x, points[i].y + prevRadius.y },
            { points[i + 1].x - radius.x, points[i + 1].y - radius.y },
            { points[i + 1].x + radius.x, points[i + 1].y + radius.y }
        };

        DrawTriangleStrip(strip, 4, color);

        prevRadius = radius;
        prevNormal = normal;
    }

#else   // !SUPPORT_SPLINE_MITERS

    Vector2 delta = { 0 };
    float length = 0.0f;
    float scale = 0.0f;

    for (int i = 0; i < pointCount - 1; i++)
    {
        delta = (Vector2){ points[i + 1].x - points[i].x, points[i + 1].y - points[i].y };
        length = sqrtf(delta.x*delta.x + delta.y*delta.y);

        if (length > 0) scale = thick/(2*length);

        Vector2 radius = { -scale*delta.y, scale*delta.x };
        Vector2 strip[4] = {
            { points[i].x - radius.x, points[i].y - radius.y },
            { points[i].x + radius.x, points[i].y + radius.y },
            { points[i + 1].x - radius.x, points[i + 1].y - radius.y },
            { points[i + 1].x + radius.x, points[i + 1].y + radius.y }
        };

        DrawTriangleStrip(strip, 4, color);
    }
#endif

#if defined(SUPPORT_SPLINE_SEGMENT_CAPS)
    // TODO: Add spline segment rounded caps at the begin/end of the spline
#endif
}